

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcLightSource::~IfcLightSource(IfcLightSource *this)

{
  void *pvVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  pvVar1 = &this->field_0x40 + (long)p_Var2;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x85c370;
  *(undefined8 *)((long)pvVar1 + 0x40) = 0x85c3e8;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x85c398;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x85c3c0;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2));
  return;
}

Assistant:

IfcLightSource() : Object("IfcLightSource") {}